

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O0

int dedma(state *s,FILE *f,_Bool dry_run)

{
  uint32_t i_00;
  undefined3 uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  ent *peVar5;
  ent *peVar6;
  code *pcVar7;
  bool bVar8;
  uint local_64;
  uint local_60;
  uint32_t _b_1;
  uint32_t _a_1;
  uint32_t _b;
  uint32_t _a;
  int j;
  int i;
  ent *e1;
  ent *e0;
  filter *flt;
  _Bool dry_run_local;
  FILE *f_local;
  state *s_local;
  
  e1 = (ent *)0x0;
  s->f = f;
  pcVar7 = printf;
  if (dry_run) {
    pcVar7 = dont_printf;
  }
  (s->op).print = pcVar7;
  _a = 0;
  do {
    _j = e1;
    peVar5 = get_ent(s,_a);
    if (peVar5 == (ent *)0x0) {
      flush_cache(s);
      return 0;
    }
    if (e1 != (ent *)0x0) {
      if ((peVar5->addr < (s->filter).addr0) || ((s->filter).addr1 <= peVar5->addr)) {
        peVar5->out_of_band = true;
      }
      else {
        iVar3 = peVar5->addr - e1->addr;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        if ((iVar3 < 0x4001) || (_b = _a, (e1->out_of_band & 1U) != 0)) {
          uVar2 = _a;
          if (peVar5->addr < e1->addr + 4) {
            do {
              i_00 = uVar2;
              _b = i_00 - 1;
              bVar8 = false;
              if ((int)(_a - 0x4000) < (int)_b) {
                _j = get_ent(s,_b);
                bVar8 = _j != (ent *)0x0;
              }
              if (!bVar8) goto LAB_00102ad5;
              if (peVar5->addr == _j->addr) {
                uVar2 = peVar5->val;
                _j->addr = peVar5->addr;
                _j->val = uVar2;
                uVar1 = *(undefined3 *)&peVar5->field_0x9;
                _j->out_of_band = peVar5->out_of_band;
                *(undefined3 *)&_j->field_0x9 = uVar1;
                drop_ent(s,_a);
                _a = _a - 1;
                goto LAB_00102ad5;
              }
              if (peVar5->addr == _j->addr + 3) {
                _j->val = peVar5->val << 0x18 | _j->val;
                drop_ent(s,_a);
                _a = _a - 1;
                goto LAB_00102ad5;
              }
              if (peVar5->addr == _j->addr + 2) {
                _j->val = peVar5->val << 0x10 | _j->val;
                drop_ent(s,_a);
                _a = _a - 1;
                goto LAB_00102ad5;
              }
              if (peVar5->addr == _j->addr + 1) {
                _j->val = peVar5->val << 8 | _j->val;
                drop_ent(s,_a);
                _a = _a - 1;
                goto LAB_00102ad5;
              }
              uVar2 = _b;
            } while (peVar5->addr <= _j->addr);
            rotate_ent(s,i_00,_a);
          }
        }
        else {
          do {
            _b = _b + 1;
            bVar8 = false;
            if ((int)_b < (int)(_a + 8)) {
              _j = get_ent(s,_b);
              bVar8 = _j != (ent *)0x0;
            }
            if (!bVar8) goto LAB_00102ad5;
            iVar3 = peVar5->addr - _j->addr;
            if (iVar3 < 1) {
              iVar3 = -iVar3;
            }
          } while (iVar3 < 0x4001);
          for (; (int)_a < (int)_b; _a = _a + 1) {
            peVar6 = get_ent(s,_a);
            peVar6->out_of_band = true;
          }
          if (peVar5->addr < _j->addr) {
            uVar4 = peVar5->addr + 4;
            local_60 = (s->filter).addr0;
            if (local_60 < uVar4) {
              local_60 = uVar4;
            }
            (s->filter).addr0 = local_60;
          }
          else if (_j->addr < peVar5->addr) {
            local_64 = (s->filter).addr1;
            if (peVar5->addr < local_64) {
              local_64 = peVar5->addr;
            }
            (s->filter).addr1 = local_64;
          }
        }
      }
    }
LAB_00102ad5:
    _a = _a + 1;
    e1 = peVar5;
  } while( true );
}

Assistant:

int
dedma(struct state *s, FILE *f, bool dry_run)
{
	struct filter *flt = &s->filter;
	struct ent *e0 = NULL, *e1;
	int i, j; /* dump line numbers */

	s->f = f;
	s->op.print = (dry_run ? dont_printf : printf);

	for (i = 0; e1 = e0, e0 = get_ent(s, i); i++) {
		if (!e1)
			continue;

		if (e0->addr < flt->addr0 || e0->addr >= flt->addr1) {
			/* out of band data */
			e0->out_of_band = true;

		} else if (abs(e0->addr - e1->addr) > MAX_DELTA &&
			   !e1->out_of_band) {
			/* wrap around or out of band data not caught by
			 * the address window */

			for (j = i + 1; (j < i + MAX_OUT_OF_BAND &&
					 (e1 = get_ent(s, j))); j++) {
				if (abs(e0->addr - e1->addr) > MAX_DELTA) {
					for (; i < j; i++)
						get_ent(s, i)->out_of_band = true;

					/* shrink the address window */
					if (e1->addr > e0->addr)
						flt->addr0 = max(e0->addr + 4,
								 flt->addr0);
					else if (e1->addr < e0->addr)
						flt->addr1 = min(e0->addr,
								 flt->addr1);
					break;
				}
			}

		} else if (e0->addr < e1->addr + 4) {
			/* badly ordered write, find a place for it */

			for (j = i - 1; (j > i - MAX_DELTA &&
					 (e1 = get_ent(s, j))); j--) {
				if (e0->addr == e1->addr) {
					/* duplicated write, keep the
					 * most recent one */
					*e1 = *e0;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 3) {
					/* 8bit writes */
					e1->val |= e0->val << 24;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 2) {
					/* 16bit writes */
					e1->val |= e0->val << 16;
					drop_ent(s, i--);
					break;

				} else if (e0->addr == e1->addr + 1) {
					/* 8bit writes */
					e1->val |= e0->val << 8;
					drop_ent(s, i--);
					break;

				} else if (e0->addr > e1->addr) {
					/* unordered write */
					rotate_ent(s, j + 1, i);
					break;
				}
			}
		}
	}

	flush_cache(s);
	return 0;
}